

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

int xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)

{
  xmlSchemaNodeInfoPtr pxVar1;
  xmlSchemaValidCtxtPtr vctxt_local;
  
  pxVar1 = xmlSchemaGetFreshElemInfo(vctxt);
  vctxt->inode = pxVar1;
  if (vctxt->inode == (xmlSchemaNodeInfoPtr)0x0) {
    xmlSchemaInternalErr
              ((xmlSchemaAbstractCtxtPtr)vctxt,"xmlSchemaValidatorPushElem",
               "calling xmlSchemaGetFreshElemInfo()");
    vctxt_local._4_4_ = -1;
  }
  else {
    vctxt->nbAttrInfos = 0;
    vctxt_local._4_4_ = 0;
  }
  return vctxt_local._4_4_;
}

Assistant:

static int
xmlSchemaValidatorPushElem(xmlSchemaValidCtxtPtr vctxt)
{
    vctxt->inode = xmlSchemaGetFreshElemInfo(vctxt);
    if (vctxt->inode == NULL) {
	VERROR_INT("xmlSchemaValidatorPushElem",
	    "calling xmlSchemaGetFreshElemInfo()");
	return (-1);
    }
    vctxt->nbAttrInfos = 0;
    return (0);
}